

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_parser_t * mpca_grammar_st(char *grammar,mpca_grammar_st_t *st)

{
  mpca_grammar_st_t *x;
  int iVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_parser_t *pmVar8;
  mpc_parser_t *pmVar9;
  char *__ptr;
  mpc_result_t mVar10;
  mpc_result_t r;
  mpc_parser_t *local_78;
  mpc_parser_t *local_70;
  mpc_parser_t *local_68;
  mpc_parser_t *local_60;
  mpc_parser_t *local_58;
  mpca_grammar_st_t *local_50;
  mpc_parser_t *local_48;
  mpc_parser_t *local_40;
  char *local_38;
  
  local_50 = st;
  local_38 = grammar;
  pmVar2 = mpc_new("grammar_total");
  local_40 = pmVar2;
  pmVar3 = mpc_new("grammar");
  pmVar4 = mpc_new("term");
  pmVar5 = mpc_new("factor");
  local_58 = mpc_new("base");
  pmVar6 = mpc_total(pmVar3,mpc_soft_delete);
  pmVar6 = mpc_predictive(pmVar6);
  mpc_define(pmVar2,pmVar6);
  pmVar2 = mpc_sym("|");
  local_78 = pmVar3;
  pmVar2 = mpc_and(2,mpcf_snd_free,pmVar2,pmVar3,free);
  pmVar2 = mpc_maybe(pmVar2);
  local_48 = pmVar4;
  pmVar2 = mpc_and(2,mpcaf_grammar_or,pmVar4,pmVar2,mpc_soft_delete);
  mpc_define(pmVar3,pmVar2);
  local_70 = pmVar5;
  pmVar2 = mpc_many1(mpcaf_grammar_and,pmVar5);
  mpc_define(pmVar4,pmVar2);
  pmVar2 = mpc_sym("*");
  pmVar3 = mpc_sym("+");
  pmVar4 = mpc_sym("?");
  pmVar6 = mpc_sym("!");
  pmVar7 = mpc_int();
  pmVar7 = mpc_tok_brackets(pmVar7,free);
  pmVar8 = mpc_pass();
  x = local_50;
  pmVar2 = mpc_or(6,pmVar2,pmVar3,pmVar4,pmVar6,pmVar7,pmVar8);
  pmVar4 = local_58;
  pmVar2 = mpc_and(2,mpcaf_grammar_repeat,local_58,pmVar2,mpc_soft_delete);
  mpc_define(pmVar5,pmVar2);
  pmVar2 = mpc_string_lit();
  pmVar2 = mpc_tok(pmVar2);
  local_60 = mpc_apply_to(pmVar2,mpcaf_grammar_string,x);
  pmVar2 = mpc_char_lit();
  pmVar2 = mpc_tok(pmVar2);
  local_68 = mpc_apply_to(pmVar2,mpcaf_grammar_char,x);
  pmVar2 = mpc_regex_lit();
  pmVar3 = mpc_oneof("ms");
  pmVar3 = mpc_many(mpcf_strfold,pmVar3);
  pmVar5 = mpc_lift_val(x);
  pmVar2 = mpc_and(3,mpcaf_fold_regex,pmVar2,pmVar3,pmVar5,free,free);
  pmVar7 = mpc_tok(pmVar2);
  pmVar2 = mpc_digits();
  pmVar3 = mpc_ident();
  pmVar2 = mpc_or(2,pmVar2,pmVar3);
  pmVar2 = mpc_tok_braces(pmVar2,free);
  pmVar8 = mpc_apply_to(pmVar2,mpcaf_grammar_id,x);
  pmVar2 = local_78;
  pmVar9 = mpc_tok_parens(local_78,mpc_soft_delete);
  pmVar6 = local_40;
  pmVar5 = local_48;
  pmVar3 = local_70;
  pmVar7 = mpc_or(5,local_60,local_68,pmVar7,pmVar8,pmVar9);
  mpc_define(pmVar4,pmVar7);
  mpc_optimise(pmVar6);
  mpc_optimise(pmVar2);
  mpc_optimise(pmVar3);
  mpc_optimise(pmVar5);
  mpc_optimise(pmVar4);
  iVar1 = mpc_parse("<mpc_grammar_compiler>",local_38,pmVar6,&r);
  if (iVar1 == 0) {
    __ptr = mpc_err_string(r.error);
    mVar10.error = (mpc_err_t *)mpc_failf("Invalid Grammar: %s",__ptr);
    mpc_err_delete(r.error);
    pmVar3 = local_70;
    free(__ptr);
    pmVar2 = local_78;
    r.error = mVar10.error;
  }
  mpc_cleanup(5,pmVar6,pmVar2,pmVar5,pmVar3,pmVar4);
  mpc_optimise((mpc_parser_t *)r.error);
  if ((x->flags & 1) != 0) {
    r.error = (mpc_err_t *)mpc_predictive(r.error);
  }
  return (mpc_parser_t *)r.error;
}

Assistant:

mpc_parser_t *mpca_grammar_st(const char *grammar, mpca_grammar_st_t *st) {

  char *err_msg;
  mpc_parser_t *err_out;
  mpc_result_t r;
  mpc_parser_t *GrammarTotal, *Grammar, *Term, *Factor, *Base;

  GrammarTotal = mpc_new("grammar_total");
  Grammar = mpc_new("grammar");
  Term = mpc_new("term");
  Factor = mpc_new("factor");
  Base = mpc_new("base");

  mpc_define(GrammarTotal,
    mpc_predictive(mpc_total(Grammar, mpc_soft_delete))
  );

  mpc_define(Grammar, mpc_and(2, mpcaf_grammar_or,
    Term,
    mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_sym("|"), Grammar, free)),
    mpc_soft_delete
  ));

  mpc_define(Term, mpc_many1(mpcaf_grammar_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcaf_grammar_repeat,
    Base,
      mpc_or(6,
        mpc_sym("*"),
        mpc_sym("+"),
        mpc_sym("?"),
        mpc_sym("!"),
        mpc_tok_brackets(mpc_int(), free),
        mpc_pass()),
    mpc_soft_delete
  ));

  mpc_define(Base, mpc_or(5,
    mpc_apply_to(mpc_tok(mpc_string_lit()), mpcaf_grammar_string, st),
    mpc_apply_to(mpc_tok(mpc_char_lit()),   mpcaf_grammar_char, st),
    mpc_tok(mpc_and(3, mpcaf_fold_regex, mpc_regex_lit(), mpc_many(mpcf_strfold, mpc_oneof("ms")), mpc_lift_val(st), free, free)),
    mpc_apply_to(mpc_tok_braces(mpc_or(2, mpc_digits(), mpc_ident()), free), mpcaf_grammar_id, st),
    mpc_tok_parens(Grammar, mpc_soft_delete)
  ));

  mpc_optimise(GrammarTotal);
  mpc_optimise(Grammar);
  mpc_optimise(Factor);
  mpc_optimise(Term);
  mpc_optimise(Base);

  if(!mpc_parse("<mpc_grammar_compiler>", grammar, GrammarTotal, &r)) {
    err_msg = mpc_err_string(r.error);
    err_out = mpc_failf("Invalid Grammar: %s", err_msg);
    mpc_err_delete(r.error);
    free(err_msg);
    r.output = err_out;
  }

  mpc_cleanup(5, GrammarTotal, Grammar, Term, Factor, Base);

  mpc_optimise(r.output);

  return (st->flags & MPCA_LANG_PREDICTIVE) ? mpc_predictive(r.output) : r.output;

}